

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SegReaderCursorAppend(Fts3MultiSegReader *pCsr,Fts3SegReader *pNew)

{
  Fts3SegReader **pOld;
  uint uVar1;
  
  uVar1 = pCsr->nSegment;
  pOld = pCsr->apSegment;
  if ((uVar1 & 0xf) == 0) {
    pOld = (Fts3SegReader **)sqlite3_realloc64(pOld,(long)(int)uVar1 * 8 + 0x80);
    if (pOld == (Fts3SegReader **)0x0) {
      sqlite3Fts3SegReaderFree(pNew);
      return 7;
    }
    pCsr->apSegment = pOld;
    uVar1 = pCsr->nSegment;
  }
  pCsr->nSegment = uVar1 + 1;
  pOld[(int)uVar1] = pNew;
  return 0;
}

Assistant:

static int fts3SegReaderCursorAppend(
  Fts3MultiSegReader *pCsr, 
  Fts3SegReader *pNew
){
  if( (pCsr->nSegment%16)==0 ){
    Fts3SegReader **apNew;
    sqlite3_int64 nByte = (pCsr->nSegment + 16)*sizeof(Fts3SegReader*);
    apNew = (Fts3SegReader **)sqlite3_realloc64(pCsr->apSegment, nByte);
    if( !apNew ){
      sqlite3Fts3SegReaderFree(pNew);
      return SQLITE_NOMEM;
    }
    pCsr->apSegment = apNew;
  }
  pCsr->apSegment[pCsr->nSegment++] = pNew;
  return SQLITE_OK;
}